

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O3

ArrayFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_multiarraytype(FeatureType *this)

{
  ulong uVar1;
  ArrayFeatureType *pAVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 5) {
    pAVar2 = (ArrayFeatureType *)(this->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 5;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pAVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (arena);
    (this->Type_).multiarraytype_ = pAVar2;
  }
  return pAVar2;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType* FeatureType::mutable_multiarraytype() {
  ::CoreML::Specification::ArrayFeatureType* _msg = _internal_mutable_multiarraytype();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.multiArrayType)
  return _msg;
}